

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GC.cpp
# Opt level: O0

void __thiscall luna::GC::CheckGC(GC *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  clock_t cVar8;
  clock_t cVar9;
  ulong uVar10;
  ostream *poVar11;
  long in_RDI;
  uint microseconds;
  clock_t duration;
  clock_t start;
  char *gc_name;
  uint gen2_threshold;
  uint gen2_count;
  uint gen1_threshold;
  uint gen1_count;
  uint gen0_threshold;
  uint gen0_count;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  char *local_28;
  
  if (*(uint *)(in_RDI + 0xc) <= *(uint *)(in_RDI + 8)) {
    uVar1 = *(uint *)(in_RDI + 8);
    uVar2 = *(uint *)(in_RDI + 0xc);
    uVar3 = *(uint *)(in_RDI + 0x18);
    uVar4 = *(uint *)(in_RDI + 0x1c);
    uVar5 = *(uint *)(in_RDI + 0x28);
    uVar6 = *(uint *)(in_RDI + 0x2c);
    cVar8 = clock();
    if (*(uint *)(in_RDI + 0x18) < *(uint *)(in_RDI + 0x1c)) {
      local_28 = "minor";
      MinorGC((GC *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    }
    else {
      local_28 = "major";
      MajorGC((GC *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    }
    cVar9 = clock();
    uVar7 = (uint)(((cVar9 - cVar8) * 1000000) / 1000000);
    uVar10 = std::ofstream::is_open();
    if ((uVar10 & 1) != 0) {
      poVar11 = std::operator<<((ostream *)(in_RDI + 0xe0),local_28);
      poVar11 = std::operator<<(poVar11,"[");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar7);
      poVar11 = std::operator<<(poVar11," microseconds]: ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar1);
      poVar11 = std::operator<<(poVar11," ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar2);
      poVar11 = std::operator<<(poVar11," | ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar3);
      poVar11 = std::operator<<(poVar11," ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar4);
      poVar11 = std::operator<<(poVar11," | ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar5);
      poVar11 = std::operator<<(poVar11," ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar6);
      poVar11 = std::operator<<(poVar11," - ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,*(uint *)(in_RDI + 8));
      poVar11 = std::operator<<(poVar11," ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,*(uint *)(in_RDI + 0xc));
      poVar11 = std::operator<<(poVar11," | ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,*(uint *)(in_RDI + 0x18));
      poVar11 = std::operator<<(poVar11," ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,*(uint *)(in_RDI + 0x1c));
      poVar11 = std::operator<<(poVar11," | ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,*(uint *)(in_RDI + 0x28));
      poVar11 = std::operator<<(poVar11," ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,*(uint *)(in_RDI + 0x2c));
      std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void GC::CheckGC()
    {
        if (gen0_.count_ >= gen0_.threshold_count_)
        {
            unsigned int gen0_count = gen0_.count_;
            unsigned int gen0_threshold = gen0_.threshold_count_;
            unsigned int gen1_count = gen1_.count_;
            unsigned int gen1_threshold = gen1_.threshold_count_;
            unsigned int gen2_count = gen2_.count_;
            unsigned int gen2_threshold = gen2_.threshold_count_;

            const char *gc_name = "";
            clock_t start = clock();
            if (gen1_.count_ >= gen1_.threshold_count_)
            {
                gc_name = "major";
                MajorGC();
            }
            else
            {
                gc_name = "minor";
                MinorGC();
            }

            clock_t duration = clock() - start;
            unsigned int microseconds = duration * 1000000 / CLOCKS_PER_SEC;
            GC_LOG(gc_name << "[" << microseconds << " microseconds]: " <<
                   gen0_count << " " << gen0_threshold << " | " <<
                   gen1_count << " " << gen1_threshold << " | " <<
                   gen2_count << " " << gen2_threshold << " - " <<
                   gen0_.count_ << " " << gen0_.threshold_count_ << " | " <<
                   gen1_.count_ << " " << gen1_.threshold_count_ << " | " <<
                   gen2_.count_ << " " << gen2_.threshold_count_);
        }
    }